

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

bool __thiscall
Diligent::Serializer<(Diligent::SerializerMode)0>::Serialize
          (Serializer<(Diligent::SerializerMode)0> *this,SerializedData *Data)

{
  bool bVar1;
  void *local_58;
  SerializedData local_50;
  void *local_30;
  void *Ptr;
  size_t Size;
  SerializedData *Data_local;
  Serializer<(Diligent::SerializerMode)0> *this_local;
  
  Ptr = (void *)0x0;
  local_30 = (void *)0x0;
  Size = (size_t)Data;
  Data_local = (SerializedData *)this;
  bVar1 = SerializeBytes(this,&local_30,(ConstQual<size_t> *)&Ptr,8);
  if (bVar1) {
    if (Ptr == (void *)0x0) {
      local_58 = (void *)0x0;
    }
    else {
      local_58 = local_30;
    }
    SerializedData::SerializedData(&local_50,local_58,(size_t)Ptr);
    SerializedData::operator=((SerializedData *)Size,&local_50);
    SerializedData::~SerializedData(&local_50);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Serializer<SerializerMode::Read>::Serialize(SerializedData& Data)
{
    size_t      Size = 0;
    const void* Ptr  = nullptr;
    if (!SerializeBytes(Ptr, Size))
        return false;
    Data = SerializedData{Size > 0 ? const_cast<void*>(Ptr) : nullptr, Size};
    return true;
}